

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O3

void __thiscall tt::detail::ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  if (iVar1 == 0) {
    CurrentThread::cacheTid();
    iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  }
  *this->m_tid = iVar1;
  this->m_tid = (pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  if ((this->m_name)._M_string_length == 0) {
    pcVar2 = "tt_Thread";
  }
  else {
    pcVar2 = (this->m_name)._M_dataplus._M_p;
  }
  *(char **)(in_FS_OFFSET + -0x48) = pcVar2;
  lVar3 = 0xf;
  prctl(0xf);
  if ((this->m_func).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_func)._M_invoker)((_Any_data *)this);
    *(char **)(in_FS_OFFSET + -0x48) = "finish";
    return;
  }
  std::__throw_bad_function_call();
  pthread_cond_destroy((pthread_cond_t *)(lVar3 + 0x40));
  pthread_mutex_lock((pthread_mutex_t *)(lVar3 + 8));
  pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 8));
  return;
}

Assistant:

void runInThread(){
			*m_tid = tt::CurrentThread::tid();
			m_tid = NULL;
			m_latch->countDown();
			m_latch = NULL;
			
			tt::CurrentThread::t_threadName = m_name.empty() ? "tt_Thread" : m_name.c_str();

			::prctl(PR_SET_NAME,tt::CurrentThread::t_threadName);

	/*		try{
				m_func();
				tt::CurrentThread::t_threadName = "finish";
			}catch (const Exception& ex){
*/
			m_func();
			tt::CurrentThread::t_threadName = "finish";
		}